

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O1

NodeRange * __thiscall trieste::Match::operator[](Match *this,Token *token)

{
  pointer ppVar1;
  TokenDef *pTVar2;
  _Base_ptr p_Var3;
  NodeRange *pNVar4;
  size_t sVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  bool bVar8;
  
  sVar5 = this->index;
  ppVar1 = (this->captures).
           super__Vector_base<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>,_std::allocator<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar2 = token->def;
  do {
    if (ppVar1[sVar5].first == true) {
      p_Var3 = (_Base_ptr)((long)&ppVar1[sVar5].second._M_t._M_impl + 8);
      p_Var6 = p_Var3;
      for (p_Var7 = *(_Base_ptr *)((long)&ppVar1[sVar5].second._M_t._M_impl + 0x10);
          p_Var7 != (_Base_ptr)0x0; p_Var7 = (&p_Var7->_M_left)[*(TokenDef **)(p_Var7 + 1) < pTVar2]
          ) {
        if (*(TokenDef **)(p_Var7 + 1) >= pTVar2) {
          p_Var6 = p_Var7;
        }
      }
      p_Var7 = p_Var3;
      if ((p_Var6 != p_Var3) && (p_Var7 = p_Var6, pTVar2 < *(TokenDef **)(p_Var6 + 1))) {
        p_Var7 = p_Var3;
      }
      pNVar4 = (NodeRange *)&p_Var7[1]._M_parent;
      if (p_Var7 == p_Var3) goto LAB_001af68f;
      bVar8 = false;
    }
    else {
LAB_001af68f:
      bVar8 = sVar5 != 0;
      pNVar4 = &operator[]::empty;
    }
    sVar5 = sVar5 - 1;
    if (!bVar8) {
      return pNVar4;
    }
  } while( true );
}

Assistant:

const NodeRange& operator[](const Token& token)
    {
      static const NodeRange empty;

      for (size_t i = index;; i--)
      {
        const auto& [valid, map] = captures[i];
        if (valid)
        {
          auto it = map.find(token);
          if ((it != map.end()))
          {
            return it->second;
          }
        }
        if (i == 0)
          break;
      }

      return empty;
    }